

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O3

Statement * rsg::anon_unknown_0::create<rsg::ConditionalStatement>(GeneratorState *state)

{
  Statement *pSVar1;
  
  pSVar1 = (Statement *)operator_new(0x38);
  pSVar1->_vptr_Statement = (_func_int **)&PTR__ConditionalStatement_0018b9c0;
  pSVar1[1]._vptr_Statement = (_func_int **)0x0;
  pSVar1[2]._vptr_Statement = (_func_int **)0x0;
  pSVar1[3]._vptr_Statement = (_func_int **)0x0;
  ValueScope::ValueScope((ValueScope *)(pSVar1 + 4));
  return pSVar1;
}

Assistant:

float		getWeight	(const GeneratorState& state)	{ return T::getWeight(state);	}